

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxRuntime.cpp
# Opt level: O0

BufferPtr __thiscall
Jinx::Impl::Runtime::Compile
          (Runtime *this,BufferPtr *scriptBuffer,String *name,
          initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
          libraries)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
  libraries_00;
  bool bVar1;
  element_type *peVar2;
  uint8_t *start;
  uint8_t *puVar3;
  size_t sVar4;
  SymbolList *pSVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  size_type in_R9;
  BufferPtr BVar6;
  lock_guard<std::mutex> local_2aa0;
  lock_guard<std::mutex> lock;
  duration<long,_std::ratio<1L,_1000000000L>_> local_2a90;
  long local_2a88;
  uint64_t compilationTimeNs;
  time_point end;
  enable_shared_from_this<Jinx::Impl::Runtime> local_2a68;
  undefined1 local_2a58 [8];
  Parser parser;
  undefined1 local_a8 [8];
  Lexer lexer;
  time_point begin;
  String *name_local;
  BufferPtr *scriptBuffer_local;
  Runtime *this_local;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
  libraries_local;
  
  lexer.m_symbolTypeMap = (SymbolTypeMap *)std::chrono::_V2::system_clock::now();
  peVar2 = std::__shared_ptr_access<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )name);
  start = Buffer::Ptr(peVar2);
  peVar2 = std::__shared_ptr_access<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )name);
  puVar3 = Buffer::Ptr(peVar2);
  peVar2 = std::__shared_ptr_access<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )name);
  sVar4 = Buffer::Size(peVar2);
  Lexer::Lexer((Lexer *)local_a8,
               (SymbolTypeMap *)
               &scriptBuffer[0x11b].super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(char *)start,(char *)(puVar3 + sVar4),libraries._M_array);
  bVar1 = Lexer::Execute((Lexer *)local_a8);
  if (bVar1) {
    bVar1 = IsLogSymbolsEnabled();
    if (bVar1) {
      pSVar5 = Lexer::GetSymbolList((Lexer *)local_a8);
      LogSymbols((Runtime *)scriptBuffer,pSVar5);
    }
    std::enable_shared_from_this<Jinx::Impl::Runtime>::shared_from_this(&local_2a68);
    pSVar5 = Lexer::GetSymbolList((Lexer *)local_a8);
    libraries_00._M_len = in_R9;
    libraries_00._M_array = (iterator)libraries._M_len;
    end.__d.__r = (duration)(duration)libraries._M_len;
    Parser::Parser((Parser *)local_2a58,(RuntimeIPtr *)&local_2a68,pSVar5,libraries._M_array,
                   libraries_00);
    std::shared_ptr<Jinx::Impl::Runtime>::~shared_ptr
              ((shared_ptr<Jinx::Impl::Runtime> *)&local_2a68);
    bVar1 = Parser::Execute((Parser *)local_2a58);
    if (bVar1) {
      bVar1 = IsLogBytecodeEnabled();
      if (bVar1) {
        LogBytecode((Runtime *)scriptBuffer,(Parser *)local_2a58);
      }
      compilationTimeNs = std::chrono::_V2::system_clock::now();
      lock._M_device =
           (mutex_type *)
           std::chrono::operator-
                     ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       *)&compilationTimeNs,
                      (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       *)&lexer.m_symbolTypeMap);
      local_2a90.__r =
           (rep)std::chrono::
                duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                          ((duration<long,_std::ratio<1L,_1000000000L>_> *)&lock);
      local_2a88 = Catch::clara::std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                             (&local_2a90);
      std::lock_guard<std::mutex>::lock_guard(&local_2aa0,(mutex_type *)(scriptBuffer + 0x115));
      scriptBuffer[0x119].super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           ((long)&(scriptBuffer[0x119].super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->m_data + 1);
      scriptBuffer[0x117].super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              ((long)&(scriptBuffer[0x117].
                       super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi)->_vptr__Sp_counted_base + local_2a88);
      Parser::GetBytecode((Parser *)this);
      parser._10648_4_ = 1;
      std::lock_guard<std::mutex>::~lock_guard(&local_2aa0);
    }
    else {
      std::shared_ptr<Jinx::Buffer>::shared_ptr((shared_ptr<Jinx::Buffer> *)this,(nullptr_t)0x0);
      parser._10648_4_ = 1;
    }
    Parser::~Parser((Parser *)local_2a58);
  }
  else {
    std::shared_ptr<Jinx::Buffer>::shared_ptr((shared_ptr<Jinx::Buffer> *)this,(nullptr_t)0x0);
    parser._10648_4_ = 1;
  }
  Lexer::~Lexer((Lexer *)local_a8);
  BVar6.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  BVar6.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (BufferPtr)BVar6.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline_t BufferPtr Runtime::Compile(BufferPtr scriptBuffer, String name, std::initializer_list<String> libraries)
	{
		// Mark script execution start time
		auto begin = std::chrono::high_resolution_clock::now();

		// Lex script text into tokens
		Lexer lexer(m_symbolTypeMap, reinterpret_cast<const char *>(scriptBuffer->Ptr()), reinterpret_cast<const char *>(scriptBuffer->Ptr() + scriptBuffer->Size()), name);

		// Exit if errors when lexing
		if (!lexer.Execute())
			return nullptr;

		// Log all lexed symbols for development and debug purposes
		if (IsLogSymbolsEnabled())
			LogSymbols(lexer.GetSymbolList());

		// Create parser with symbol list
		Parser parser(shared_from_this(), lexer.GetSymbolList(), name, libraries);

		// Generate bytecode from symbol list
		if (!parser.Execute())
			return nullptr;

		// Log bytecode for development and debug purposes
		if (IsLogBytecodeEnabled())
			LogBytecode(parser);

		// Track accumulated script compilation time and count
		auto end = std::chrono::high_resolution_clock::now();
		uint64_t compilationTimeNs = std::chrono::duration_cast<std::chrono::nanoseconds>(end - begin).count();
		std::lock_guard<std::mutex> lock(m_perfMutex);
		m_perfStats.scriptCompilationCount++;
		m_perfStats.compilationTimeNs += compilationTimeNs;

		// Return the bytecode
		return parser.GetBytecode();
	}